

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

void Str_ManNormalize_rec
               (Str_Ntk_t *pNtk,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Wec_t *vGroups,Vec_Int_t *vRoots)

{
  uint Lit;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Str_Obj_t *pSVar10;
  int t;
  int iVar11;
  uint uVar12;
  int pFanins [3];
  
  if (pObj->Value == 0xffffffff) {
    pObj->Value = 0;
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x285,
                    "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Gia_ObjIsMux(p,pObj);
    if (iVar1 == 0) {
      if (p->vSuper == (Vec_Int_t *)0x0) {
        pVVar7 = Vec_IntAlloc(100);
        p->vSuper = pVVar7;
      }
      else {
        p->vSuper->nSize = 0;
      }
      iVar1 = Gia_ObjIsXor(pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAndReal(p,pObj);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x270,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
        }
        Gia_ManSuperCollectAnd_rec
                  (p,(Gia_Obj_t *)
                     ((ulong)((uint)*(undefined8 *)pObj >> 0x1d & 1) ^
                     (ulong)(pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff))));
        pGVar8 = Gia_ObjChild1(pObj);
        Gia_ManSuperCollectAnd_rec(p,pGVar8);
        Vec_IntSort(p->vSuper,(int)pGVar8);
        Gia_ManSimplifyAnd(p->vSuper);
      }
      else {
        if ((*(ulong *)pObj & 0x2000000020000000) != 0) {
          __assert_fail("!Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x263,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
        }
        Gia_ManSuperCollectXor_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff));
        pGVar8 = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff);
        Gia_ManSuperCollectXor_rec(p,pGVar8);
        Vec_IntSort(p->vSuper,(int)pGVar8);
        Gia_ManSimplifyXor(p->vSuper);
      }
      if (0 < p->vSuper->nSize) {
        uVar6 = p->vStore->nSize;
        Vec_IntAppend(p->vStore,p->vSuper);
        iVar1 = p->vStore->nSize;
        for (uVar12 = uVar6; pVVar7 = p->vStore, (int)uVar12 < iVar1; uVar12 = uVar12 + 1) {
          iVar2 = Vec_IntEntry(pVVar7,uVar12);
          iVar4 = Abc_Lit2Var(iVar2);
          pGVar8 = Gia_ManObj(p,iVar4);
          Str_ManNormalize_rec(pNtk,p,pGVar8,vGroups,vRoots);
          pVVar7 = p->vStore;
          Lit = pGVar8->Value;
          iVar2 = Abc_LitIsCompl(iVar2);
          iVar2 = Abc_LitNotCond(Lit,iVar2);
          Vec_IntWriteEntry(pVVar7,uVar12,iVar2);
        }
        if (pVVar7->nSize == iVar1) {
          if ((-1 < (int)uVar6) && (iVar1 - uVar6 != 0 && (int)uVar6 <= iVar1)) {
            iVar2 = Gia_ObjIsXor(pObj);
            uVar12 = Str_ObjCreate(pNtk,4 - (uint)(iVar2 == 0),iVar1 - uVar6,pVVar7->pArray + uVar6)
            ;
            pObj->Value = uVar12;
            Vec_IntShrink(p->vStore,uVar6);
            return;
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        __assert_fail("Vec_IntSize(p->vStore) == iEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x2d3,
                      "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                     );
      }
      __assert_fail("Vec_IntSize(p->vSuper) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x271,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar1 = Gia_ObjId(p,pObj);
    iVar1 = Vec_IntEntry(vRoots,iVar1);
    if (iVar1 == -1) {
      Str_ManNormalize_rec(pNtk,p,pObj + -(*(ulong *)pObj & 0x1fffffff),vGroups,vRoots);
      Str_ManNormalize_rec
                (pNtk,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),vGroups,vRoots);
      pGVar8 = Gia_ObjFanin2(p,pObj);
      Str_ManNormalize_rec(pNtk,p,pGVar8,vGroups,vRoots);
      iVar1 = Gia_ObjFanin0Copy(pObj);
      pFanins[0] = iVar1;
      iVar2 = Gia_ObjFanin1Copy(pObj);
      pFanins[1] = iVar2;
      iVar4 = Gia_ObjFanin2Copy(p,pObj);
      pFanins[2] = iVar4;
      iVar11 = Abc_LitIsCompl(iVar4);
      if (iVar11 != 0) {
        pFanins[2] = Abc_LitNot(iVar4);
        pFanins[0] = iVar2;
        pFanins[1] = iVar1;
      }
      uVar6 = Str_ObjCreate(pNtk,5,3,pFanins);
      pObj->Value = uVar6;
    }
    else {
      iVar1 = Gia_ObjId(p,pObj);
      iVar1 = Vec_IntEntry(vRoots,iVar1);
      pVVar7 = Vec_WecEntry(vGroups,iVar1);
      for (iVar1 = 0; iVar1 < pVVar7->nSize; iVar1 = iVar1 + 1) {
        iVar2 = Vec_IntEntry(pVVar7,iVar1);
        pGVar8 = Gia_ManObj(p,iVar2);
        if (pGVar8 == (Gia_Obj_t *)0x0) break;
        Str_MuxInputsCollect(p,pGVar8,p->vSuper);
        iVar2 = p->vStore->nSize;
        Vec_IntAppend(p->vStore,p->vSuper);
        iVar4 = p->vStore->nSize;
        for (iVar11 = iVar2; iVar11 < iVar4; iVar11 = iVar11 + 1) {
          iVar3 = Vec_IntEntry(p->vStore,iVar11);
          pGVar8 = Gia_ManObj(p,iVar3);
          Str_ManNormalize_rec(pNtk,p,pGVar8,vGroups,vRoots);
        }
        Vec_IntShrink(p->vStore,iVar2);
      }
      for (iVar1 = 0; iVar1 < pVVar7->nSize; iVar1 = iVar1 + 1) {
        iVar2 = Vec_IntEntry(pVVar7,iVar1);
        pGVar8 = Gia_ManObj(p,iVar2);
        if (pGVar8 == (Gia_Obj_t *)0x0) break;
        Str_MuxStructCollect(p,pGVar8,p->vSuper);
        for (iVar2 = 0; iVar2 < p->vSuper->nSize; iVar2 = iVar2 + 1) {
          iVar4 = Vec_IntEntry(p->vSuper,iVar2);
          pGVar9 = Gia_ManObj(p,iVar4);
          if (pGVar9 == (Gia_Obj_t *)0x0) break;
          iVar4 = Gia_ObjFanin0Copy(pGVar9);
          pFanins[0] = iVar4;
          iVar11 = Gia_ObjFanin1Copy(pGVar9);
          pFanins[1] = iVar11;
          iVar3 = Gia_ObjFanin2Copy(p,pGVar9);
          pFanins[2] = iVar3;
          iVar5 = Abc_LitIsCompl(iVar3);
          if (iVar5 != 0) {
            pFanins[2] = Abc_LitNot(iVar3);
            pFanins[0] = iVar11;
            pFanins[1] = iVar4;
          }
          uVar6 = Str_ObjCreate(pNtk,5,3,pFanins);
          pGVar9->Value = uVar6;
        }
        if (pGVar8->Value == 0xffffffff) {
          __assert_fail("~pRoot->Value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x2b7,
                        "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                       );
        }
        for (iVar2 = 0; iVar2 < p->vSuper->nSize; iVar2 = iVar2 + 1) {
          iVar4 = Vec_IntEntry(p->vSuper,iVar2);
          pGVar9 = Gia_ManObj(p,iVar4);
          if (pGVar9 == (Gia_Obj_t *)0x0) break;
          iVar4 = Abc_Lit2Var(pGVar8->Value);
          iVar11 = Abc_Lit2Var(pGVar9->Value);
          pSVar10 = Str_NtkObj(pNtk,iVar11);
          pSVar10->iTop = iVar4;
        }
        pNtk->nTrees = pNtk->nTrees + 1;
      }
      if (pObj->Value == 0xffffffff) {
        __assert_fail("~pObj->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x2bd,
                      "void Str_ManNormalize_rec(Str_Ntk_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Wec_t *, Vec_Int_t *)"
                     );
      }
      if ((long)pVVar7->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      pGVar8 = Gia_ManObj(p,pVVar7->pArray[(long)pVVar7->nSize + -1]);
      for (iVar1 = 0; iVar1 < pVVar7->nSize; iVar1 = iVar1 + 1) {
        iVar2 = Vec_IntEntry(pVVar7,iVar1);
        pGVar9 = Gia_ManObj(p,iVar2);
        if (pGVar9 == (Gia_Obj_t *)0x0) break;
        iVar2 = Abc_Lit2Var(pGVar8->Value);
        iVar4 = Abc_Lit2Var(pGVar9->Value);
        pSVar10 = Str_NtkObj(pNtk,iVar4);
        pSVar10->iTop = iVar2;
      }
      pNtk->nGroups = pNtk->nGroups + 1;
    }
  }
  return;
}

Assistant:

void Str_ManNormalize_rec( Str_Ntk_t * pNtk, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Wec_t * vGroups, Vec_Int_t * vRoots )
{
    int i, k, iVar, iLit, iBeg, iEnd;
    if ( ~pObj->Value )
        return;
    pObj->Value = 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsMux(p, pObj) )
    {
        Vec_Int_t * vGroup;
        Gia_Obj_t * pRoot, * pMux;
        int pFanins[3];
        if ( Vec_IntEntry(vRoots, Gia_ObjId(p, pObj)) == -1 )
        {
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin0(pObj), vGroups, vRoots );
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin1(pObj), vGroups, vRoots );
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin2(p, pObj), vGroups, vRoots );
            pFanins[0] = Gia_ObjFanin0Copy(pObj);
            pFanins[1] = Gia_ObjFanin1Copy(pObj);
            pFanins[2] = Gia_ObjFanin2Copy(p, pObj);
            if ( Abc_LitIsCompl(pFanins[2]) )
            {
                pFanins[2] = Abc_LitNot(pFanins[2]);
                ABC_SWAP( int, pFanins[0], pFanins[1] );
            }
            pObj->Value = Str_ObjCreate( pNtk, STR_MUX, 3, pFanins );
            return;
        }
        vGroup = Vec_WecEntry( vGroups, Vec_IntEntry(vRoots, Gia_ObjId(p, pObj)) );
        // build data-inputs for each tree
        Gia_ManForEachObjVec( vGroup, p, pRoot, i )
        {
            Str_MuxInputsCollect( p, pRoot, p->vSuper );
            iBeg = Vec_IntSize( p->vStore );
            Vec_IntAppend( p->vStore, p->vSuper );
            iEnd = Vec_IntSize( p->vStore );
            Vec_IntForEachEntryStartStop( p->vStore, iVar, k, iBeg, iEnd )
                Str_ManNormalize_rec( pNtk, p, Gia_ManObj(p, iVar), vGroups, vRoots );
            Vec_IntShrink( p->vStore, iBeg );
        }
        // build internal structures
        Gia_ManForEachObjVec( vGroup, p, pRoot, i )
        {
            Str_MuxStructCollect( p, pRoot, p->vSuper );
            Gia_ManForEachObjVec( p->vSuper, p, pMux, k )
            {
                pFanins[0] = Gia_ObjFanin0Copy(pMux);
                pFanins[1] = Gia_ObjFanin1Copy(pMux);
                pFanins[2] = Gia_ObjFanin2Copy(p, pMux);
                if ( Abc_LitIsCompl(pFanins[2]) )
                {
                    pFanins[2] = Abc_LitNot(pFanins[2]);
                    ABC_SWAP( int, pFanins[0], pFanins[1] );
                }
                pMux->Value = Str_ObjCreate( pNtk, STR_MUX, 3, pFanins );
            }
            assert( ~pRoot->Value );
            // set mapping
            Gia_ManForEachObjVec( p->vSuper, p, pMux, k )
                Str_NtkObj(pNtk, Abc_Lit2Var(pMux->Value))->iTop = Abc_Lit2Var(pRoot->Value);
            pNtk->nTrees++;
        }
        assert( ~pObj->Value );
        // set mapping
        pObj = Gia_ManObj( p, Vec_IntEntryLast(vGroup) );
        Gia_ManForEachObjVec( vGroup, p, pRoot, i )
            Str_NtkObj(pNtk, Abc_Lit2Var(pRoot->Value))->iTop = Abc_Lit2Var(pObj->Value);
        pNtk->nGroups++;
        //printf( "%d x %d  ", Vec_IntSize(vGroup), Vec_IntSize(p->vSuper) );
        return;
    }
    // find supergate
    Gia_ManSuperCollect( p, pObj );
    // save entries
    iBeg = Vec_IntSize( p->vStore );
    Vec_IntAppend( p->vStore, p->vSuper );
    iEnd = Vec_IntSize( p->vStore );
    // call recursively
    Vec_IntForEachEntryStartStop( p->vStore, iLit, i, iBeg, iEnd )
    {
        Gia_Obj_t * pTemp = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        Str_ManNormalize_rec( pNtk, p, pTemp, vGroups, vRoots );
        Vec_IntWriteEntry( p->vStore, i, Abc_LitNotCond(pTemp->Value, Abc_LitIsCompl(iLit)) );
    }
    assert( Vec_IntSize(p->vStore) == iEnd );
    // consider general case
    pObj->Value = Str_ObjCreate( pNtk, Gia_ObjIsXor(pObj) ? STR_XOR : STR_AND, iEnd-iBeg, Vec_IntEntryP(p->vStore, iBeg) );
    Vec_IntShrink( p->vStore, iBeg );
}